

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::fix_up_interpolant_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  bool bVar1;
  uint32_t value;
  SPIRVariable *var;
  size_type sVar2;
  SPIRType *type;
  SPIRConstant *pSVar3;
  CompilerError *this_00;
  uint32_t id;
  ulong uVar4;
  allocator local_69;
  SPIRType *local_68;
  SPIRType *local_60;
  ulong local_58;
  string local_50;
  
  var = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  if (var != (SPIRVariable *)0x0) {
    local_50._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
    sVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->pull_model_inputs)._M_h,(key_type *)&local_50);
    if (sVar2 != 0) {
      type = Compiler::get_variable_data_type((Compiler *)this,var);
      local_68 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*ops);
      bVar1 = Compiler::has_extended_decoration
                        ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
      if (bVar1) {
        value = Compiler::get_extended_decoration
                          ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
      }
      else {
        if (*(int *)&(type->super_IVariant).field_0xc != 0xf) {
          __assert_fail("var_type.basetype == SPIRType::Struct",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x2050,
                        "void spirv_cross::CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *, uint32_t)"
                       );
        }
        pSVar3 = Compiler::get<spirv_cross::SPIRConstant>
                           ((Compiler *)this,
                            ops[(type->array).super_VectorView<unsigned_int>.buffer_size + 3]);
        value = Compiler::get_extended_member_decoration
                          ((Compiler *)this,(var->super_IVariant).self.id,(pSVar3->m).c[0].r[0].u32,
                           SPIRVCrossDecorationInterfaceMemberIndex);
      }
      local_58 = (ulong)length;
      local_60 = type;
      for (uVar4 = 3; uVar4 < local_58; uVar4 = uVar4 + 1) {
        bVar1 = Compiler::is_vector((Compiler *)this,type);
        if (bVar1) {
          bVar1 = Compiler::is_array((Compiler *)this,type);
          if (!bVar1) {
            bVar1 = Compiler::is_scalar((Compiler *)this,local_68);
            if (bVar1) {
              Compiler::set_extended_decoration
                        ((Compiler *)this,ops[1],SPIRVCrossDecorationInterpolantComponentExpr,
                         ops[uVar4]);
              break;
            }
          }
        }
        pSVar3 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,ops[uVar4]);
        if ((pSVar3 == (SPIRConstant *)0x0) || (pSVar3->specialization == true)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_50,
                     "Trying to dynamically index into an array interface variable using pull-model interpolation. This is currently unsupported."
                     ,&local_69);
          CompilerError::CompilerError(this_00,&local_50);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        id = (type->parent_type).id;
        if (id == 0) {
          if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
            id = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .ptr[(pSVar3->m).c[0].r[0].u32].id;
            goto LAB_0030d0f6;
          }
        }
        else {
LAB_0030d0f6:
          type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
        }
        bVar1 = Compiler::has_extended_decoration
                          ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
        if ((bVar1) || (uVar4 - 3 != (local_60->array).super_VectorView<unsigned_int>.buffer_size))
        {
          value = value + (pSVar3->m).c[0].r[0].u32;
        }
      }
      Compiler::set_extended_decoration
                ((Compiler *)this,ops[1],SPIRVCrossDecorationInterfaceMemberIndex,value);
    }
  }
  return;
}

Assistant:

void CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *ops, uint32_t length)
{
	auto *var = maybe_get_backing_variable(ops[2]);
	if (!var || !pull_model_inputs.count(var->self))
		return;
	// Get the base index.
	uint32_t interface_index;
	auto &var_type = get_variable_data_type(*var);
	auto &result_type = get<SPIRType>(ops[0]);
	auto *type = &var_type;
	if (has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex))
	{
		interface_index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);
	}
	else
	{
		// Assume an access chain into a struct variable.
		assert(var_type.basetype == SPIRType::Struct);
		auto &c = get<SPIRConstant>(ops[3 + var_type.array.size()]);
		interface_index =
		    get_extended_member_decoration(var->self, c.scalar(), SPIRVCrossDecorationInterfaceMemberIndex);
	}
	// Accumulate indices. We'll have to skip over the one for the struct, if present, because we already accounted
	// for that getting the base index.
	for (uint32_t i = 3; i < length; ++i)
	{
		if (is_vector(*type) && !is_array(*type) && is_scalar(result_type))
		{
			// We don't want to combine the next index. Actually, we need to save it
			// so we know to apply a swizzle to the result of the interpolation.
			set_extended_decoration(ops[1], SPIRVCrossDecorationInterpolantComponentExpr, ops[i]);
			break;
		}

		auto *c = maybe_get<SPIRConstant>(ops[i]);
		if (!c || c->specialization)
			SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable using pull-model "
			                  "interpolation. This is currently unsupported.");

		if (type->parent_type)
			type = &get<SPIRType>(type->parent_type);
		else if (type->basetype == SPIRType::Struct)
			type = &get<SPIRType>(type->member_types[c->scalar()]);

		if (!has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex) &&
		    i - 3 == var_type.array.size())
			continue;

		interface_index += c->scalar();
	}
	// Save this to the access chain itself so we can recover it later when calling an interpolation function.
	set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, interface_index);
}